

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall SpeciesTracker::Add(SpeciesTracker *this,string *promoter_name,Ptr *polymer)

{
  initializer_list<std::shared_ptr<Polymer>_> __l;
  size_type sVar1;
  mapped_type *pmVar2;
  shared_ptr<Polymer> *local_a0;
  allocator<std::shared_ptr<Polymer>_> local_59;
  shared_ptr<Polymer> local_58;
  shared_ptr<Polymer> local_48;
  vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_> local_38;
  Ptr *local_20;
  Ptr *polymer_local;
  string *promoter_name_local;
  SpeciesTracker *this_local;
  
  local_20 = polymer;
  polymer_local = (Ptr *)promoter_name;
  promoter_name_local = (string *)this;
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
          ::count(&this->promoter_map_,promoter_name);
  if (sVar1 == 0) {
    std::shared_ptr<Polymer>::shared_ptr(&local_58,polymer);
    local_48.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    local_48.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_58;
    std::allocator<std::shared_ptr<Polymer>_>::allocator(&local_59);
    __l._M_len = (size_type)
                 local_48.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    __l._M_array = (iterator)local_48.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::vector
              (&local_38,__l,&local_59);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](&this->promoter_map_,(key_type *)polymer_local);
    std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::operator=
              (pmVar2,&local_38);
    std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::~vector
              (&local_38);
    std::allocator<std::shared_ptr<Polymer>_>::~allocator(&local_59);
    local_a0 = &local_48;
    do {
      local_a0 = local_a0 + -1;
      std::shared_ptr<Polymer>::~shared_ptr(local_a0);
    } while (local_a0 != &local_58);
  }
  else {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](&this->promoter_map_,(key_type *)polymer_local);
    std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::push_back
              (pmVar2,polymer);
  }
  return;
}

Assistant:

void SpeciesTracker::Add(const std::string &promoter_name,
                         Polymer::Ptr polymer) {
  if (promoter_map_.count(promoter_name) == 0) {
    promoter_map_[promoter_name] = Polymer::VecPtr{polymer};
  } else {
    promoter_map_[promoter_name].push_back(polymer);
  }
}